

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O2

Result_type __thiscall
sig::
Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
::operator()(Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
             *this,int *args)

{
  bool bVar1;
  Optional_last_value<void> comb;
  unique_lock<std::mutex> lock;
  Bound_slot_container slots;
  Optional_last_value<void> local_39;
  unique_lock<std::mutex> local_38;
  Bound_slot_container local_28;
  
  bVar1 = Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
          ::enabled((Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
                     *)this);
  if (bVar1) {
    bind_args<int&>(&local_28,this,args);
    std::unique_lock<std::mutex>::unique_lock(&local_38,(mutex_type *)(this + 0xe0));
    std::unique_lock<std::mutex>::unlock(&local_38);
    Optional_last_value<void>::operator()
              (&local_39,
               (Slot_iterator<__gnu_cxx::__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>_>
                )local_28.
                 super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (Slot_iterator<__gnu_cxx::__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>_>
                )local_28.
                 super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
              (&local_28);
  }
  return;
}

Assistant:

Result_type operator()(Arguments&&... args) {
        if (!this->enabled()) {
            return Result_type();
        }
        auto slots = bind_args(std::forward<Arguments>(args)...);
        std::unique_lock<Mutex> lock{mtx_};
        auto comb = combiner_;
        lock.unlock();
        return comb(Bound_slot_iterator{std::begin(slots)},
                    Bound_slot_iterator{std::end(slots)});
    }